

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O1

void __thiscall
TPZTransfer<std::complex<float>_>::MultAddScalar
          (TPZTransfer<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  TNode *pTVar6;
  complex<float> *pcVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int64_t size;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  TPZFMatrix<std::complex<float>_> zloc;
  TPZFMatrix<std::complex<float>_> xloc;
  ulong uVar20;
  int local_210;
  TPZFMatrix<std::complex<float>_> local_1f8;
  TPZFMatrix<std::complex<float>_> local_168;
  TPZFMatrix<std::complex<float>_> local_d8;
  
  iVar13 = (int)alpha._M_value;
  if (iVar13 == 0) {
    lVar11 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  }
  else {
    lVar11 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  }
  iVar14 = iVar13;
  if (lVar11 != (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow) {
    TPZMatrix<std::complex<float>_>::Error
              ("TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>",(char *)0x0);
  }
  lVar11 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if ((lVar11 != (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
     (lVar11 != (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol)) {
    TPZMatrix<std::complex<float>_>::Error
              ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  uVar4 = (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements;
  uVar5 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  TPZMatrix<std::complex<float>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<float>_>,y,z,
             (complex<float>)(alpha._M_value & 0xffffffff),iVar14);
  if (0 < (int)uVar5) {
    uVar10 = uVar4 & 0x7fffffff;
    uVar20 = 0;
    do {
      local_210 = (int)uVar4;
      if (iVar13 == 0) {
        if (0 < local_210) {
          uVar16 = 0;
          do {
            pTVar6 = (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
            iVar14 = pTVar6[uVar16].dim;
            lVar11 = (long)iVar14;
            if ((lVar11 != 0) && (lVar15 = (long)(this->fColPosition).fStore[uVar16], lVar15 != -1))
            {
              uVar2 = (this->fNumberofColumnBlocks).fStore[uVar16];
              uVar18 = (ulong)uVar2;
              if (uVar18 != 0) {
                iVar1 = pTVar6[uVar16].pos;
                if (((iVar1 < 0) ||
                    ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                     (long)iVar1)) ||
                   ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    (long)uVar20)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_d8.fElem =
                     z->fElem +
                     (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * uVar20 +
                     (long)iVar1;
                local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
                local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed =
                     '\0';
                local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive =
                     '\0';
                local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
                local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar11;
                local_d8.fGiven = local_d8.fElem;
                local_d8.fSize = lVar11;
                TPZVec<int>::TPZVec(&local_d8.fPivot.super_TPZVec<int>,0);
                local_d8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                     (_func_int **)&PTR__TPZManVector_0183cde8;
                local_d8.fPivot.super_TPZVec<int>.fStore = local_d8.fPivot.fExtAlloc;
                local_d8.fPivot.super_TPZVec<int>.fNElements = 0;
                local_d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
                local_d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
                local_d8.fWork.fStore = (complex<float> *)0x0;
                local_d8.fWork.fNElements = 0;
                local_d8.fWork.fNAlloc = 0;
                if (0 < (int)uVar2) {
                  do {
                    pTVar6 = (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
                    iVar1 = (this->fColumnBlockNumber).super_TPZVec<int>.fStore[lVar15];
                    iVar3 = pTVar6[iVar1].dim;
                    lVar9 = (long)iVar3;
                    local_168.fElem =
                         x->fElem +
                         (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                         uVar20 + (long)pTVar6[iVar1].pos;
                    local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
                    local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed
                         = '\0';
                    local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive
                         = '\0';
                    local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
                    local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar9
                    ;
                    local_168.fGiven = local_168.fElem;
                    local_168.fSize = lVar9;
                    TPZVec<int>::TPZVec(&local_168.fPivot.super_TPZVec<int>,0);
                    local_168.fPivot.super_TPZVec<int>._vptr_TPZVec =
                         (_func_int **)&PTR__TPZManVector_0183cde8;
                    local_168.fPivot.super_TPZVec<int>.fStore = local_168.fPivot.fExtAlloc;
                    local_168.fPivot.super_TPZVec<int>.fNElements = 0;
                    local_168.fPivot.super_TPZVec<int>.fNAlloc = 0;
                    local_168.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
                    local_168.fWork.fStore = (complex<float> *)0x0;
                    local_168.fWork.fNElements = 0;
                    local_168.fWork.fNAlloc = 0;
                    if (iVar3 == 0) {
                      local_168.fElem = (complex<float> *)0x0;
                    }
                    local_1f8.fElem =
                         (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore +
                         (this->fColumnBlockPosition).super_TPZVec<int>.fStore[lVar15];
                    lVar8 = (long)(iVar14 * iVar3);
                    local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed
                         = '\0';
                    local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive
                         = '\0';
                    local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
                    local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow =
                         lVar11;
                    local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar9
                    ;
                    local_1f8.fGiven = local_1f8.fElem;
                    local_1f8.fSize = lVar8;
                    TPZVec<int>::TPZVec(&local_1f8.fPivot.super_TPZVec<int>,0);
                    local_1f8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                         (_func_int **)&PTR__TPZManVector_0183cde8;
                    local_1f8.fPivot.super_TPZVec<int>.fStore = local_1f8.fPivot.fExtAlloc;
                    local_1f8.fPivot.super_TPZVec<int>.fNElements = 0;
                    local_1f8.fPivot.super_TPZVec<int>.fNAlloc = 0;
                    local_1f8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
                    local_1f8.fWork.fStore = (complex<float> *)0x0;
                    local_1f8.fWork.fNElements = 0;
                    local_1f8.fWork.fNAlloc = 0;
                    if (iVar3 == 0) {
                      local_1f8.fElem = (complex<float> *)0x0;
                    }
                    else {
                      uVar19 = lVar9 * lVar11;
                      if (uVar19 - lVar8 != 0 && lVar8 <= (long)uVar19) {
                        sVar12 = uVar19 * 8;
                        if (0x1fffffffffffffff < uVar19) {
                          sVar12 = 0xffffffffffffffff;
                        }
                        pcVar7 = (complex<float> *)operator_new__(sVar12);
                        memset(pcVar7,0,uVar19 * 8);
                        local_1f8.fElem = pcVar7;
                      }
                    }
                    TPZFMatrix<std::complex<float>_>::MultAdd
                              (&local_1f8,&local_168,&local_d8,&local_d8,(complex<float>)0x0,beta,
                               (int)uVar20);
                    TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_1f8);
                    TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_168);
                    lVar15 = lVar15 + 1;
                    uVar18 = uVar18 - 1;
                  } while (uVar18 != 0);
                }
                TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_d8);
              }
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar10);
        }
      }
      else if (0 < local_210) {
        uVar16 = 0;
        do {
          pTVar6 = (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
          iVar14 = pTVar6[uVar16].dim;
          lVar11 = (long)iVar14;
          if (lVar11 != 0) {
            local_d8.fElem =
                 x->fElem +
                 (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * uVar20 +
                 (long)pTVar6[uVar16].pos;
            local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
            local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
            local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
            local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
            local_d8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar11;
            local_d8.fGiven = local_d8.fElem;
            local_d8.fSize = lVar11;
            TPZVec<int>::TPZVec(&local_d8.fPivot.super_TPZVec<int>,0);
            local_d8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            local_d8.fPivot.super_TPZVec<int>.fStore = local_d8.fPivot.fExtAlloc;
            local_d8.fPivot.super_TPZVec<int>.fNElements = 0;
            local_d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
            local_d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
            local_d8.fWork.fStore = (complex<float> *)0x0;
            local_d8.fWork.fNElements = 0;
            local_d8.fWork.fNAlloc = 0;
            lVar15 = (long)(this->fColPosition).fStore[uVar16];
            if ((lVar15 != -1) &&
               (lVar9 = (long)(this->fNumberofColumnBlocks).fStore[uVar16], 0 < lVar9)) {
              do {
                pTVar6 = (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
                iVar1 = (this->fColumnBlockNumber).super_TPZVec<int>.fStore[lVar15];
                lVar8 = (long)pTVar6[iVar1].pos;
                iVar1 = pTVar6[iVar1].dim;
                lVar17 = (long)iVar1;
                if ((lVar8 < 0) ||
                   (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar8 ||
                    ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                     (long)uVar20)))) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_168.fElem =
                     z->fElem +
                     (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * uVar20 +
                     lVar8;
                local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
                local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed =
                     '\0';
                local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive =
                     '\0';
                local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable
                ._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
                local_168.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar17;
                local_168.fGiven = local_168.fElem;
                local_168.fSize = lVar17;
                TPZVec<int>::TPZVec(&local_168.fPivot.super_TPZVec<int>,0);
                local_168.fPivot.super_TPZVec<int>._vptr_TPZVec =
                     (_func_int **)&PTR__TPZManVector_0183cde8;
                local_168.fPivot.super_TPZVec<int>.fStore = local_168.fPivot.fExtAlloc;
                local_168.fPivot.super_TPZVec<int>.fNElements = 0;
                local_168.fPivot.super_TPZVec<int>.fNAlloc = 0;
                local_168.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
                local_168.fWork.fStore = (complex<float> *)0x0;
                local_168.fWork.fNElements = 0;
                local_168.fWork.fNAlloc = 0;
                if (iVar1 == 0) {
                  local_168.fElem = (complex<float> *)0x0;
                }
                local_1f8.fElem =
                     (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore +
                     (this->fColumnBlockPosition).super_TPZVec<int>.fStore[lVar15];
                lVar8 = (long)(iVar14 * iVar1);
                local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed =
                     '\0';
                local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive =
                     '\0';
                local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable
                ._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
                local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar11;
                local_1f8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar17;
                local_1f8.fGiven = local_1f8.fElem;
                local_1f8.fSize = lVar8;
                TPZVec<int>::TPZVec(&local_1f8.fPivot.super_TPZVec<int>,0);
                local_1f8.fPivot.super_TPZVec<int>._vptr_TPZVec =
                     (_func_int **)&PTR__TPZManVector_0183cde8;
                local_1f8.fPivot.super_TPZVec<int>.fStore = local_1f8.fPivot.fExtAlloc;
                local_1f8.fPivot.super_TPZVec<int>.fNElements = 0;
                local_1f8.fPivot.super_TPZVec<int>.fNAlloc = 0;
                local_1f8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
                local_1f8.fWork.fStore = (complex<float> *)0x0;
                local_1f8.fWork.fNElements = 0;
                local_1f8.fWork.fNAlloc = 0;
                if (iVar1 == 0) {
                  local_1f8.fElem = (complex<float> *)0x0;
                }
                else {
                  uVar18 = lVar17 * lVar11;
                  if (uVar18 - lVar8 != 0 && lVar8 <= (long)uVar18) {
                    sVar12 = uVar18 * 8;
                    if (0x1fffffffffffffff < uVar18) {
                      sVar12 = 0xffffffffffffffff;
                    }
                    pcVar7 = (complex<float> *)operator_new__(sVar12);
                    memset(pcVar7,0,uVar18 * 8);
                    local_1f8.fElem = pcVar7;
                  }
                }
                TPZFMatrix<std::complex<float>_>::MultAdd
                          (&local_1f8,&local_d8,&local_168,&local_168,
                           (complex<float>)(alpha._M_value & 0xffffffff),beta,(int)uVar20);
                TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_1f8);
                TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_168);
                lVar15 = lVar15 + 1;
                lVar9 = lVar9 + -1;
              } while (lVar9 != 0);
            }
            TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_d8);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar10);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uVar5 & 0x7fffffff));
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::MultAddScalar(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
						  TVar alpha, TVar beta, int opt) const{
	// multiplies the transfer matrix and puts the result in z
	if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows()))
		this->Error( "TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols()) {
		this->Error ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n");
	}
	int rows = fRowBlock.MaxBlockSize();
	int xcols = x.Cols();
	int ic, c, r;
	this->PrepareZ(y,z,beta,opt);
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( r=0; r < rows; r++) {
				int rowblockpos = fRowBlock.Position(r);
				int rowblocksize = fRowBlock.Size(r);
				if(!rowblocksize) continue;
				int colpos = fColPosition[r];
				if(colpos == -1) continue;
				int numcolbl = fNumberofColumnBlocks[r];
				if(numcolbl == 0) continue;
				TPZFMatrix<TVar> zloc(rowblocksize,1,&z(rowblockpos,ic),rowblocksize);
				for( c=0; c < numcolbl; c++) {
					int col = fColumnBlockNumber[colpos+c];
					int colblockpos = fColBlock.Position(col);
					int colblocksize = fColBlock.Size(col);
					TPZFMatrix<TVar> xloc(colblocksize,1,&x.g(colblockpos,ic), colblocksize);
					TPZFMatrix<TVar> aloc(rowblocksize,colblocksize,
									&fDoubleValues[fColumnBlockPosition[colpos+c]],rowblocksize*colblocksize);
					aloc.MultAdd(xloc,zloc,zloc,alpha,1.,opt);
				}
			}
		} else {
			for ( r=0; r < rows; r++) {
				int rowblockpos = fRowBlock.Position(r);
				int rowblocksize = fRowBlock.Size(r);
				if(!rowblocksize) continue;
				TPZFMatrix<TVar> xloc(rowblocksize,1,&x.g(rowblockpos,ic),rowblocksize);
				int colpos = fColPosition[r];
				if(colpos == -1) continue;
				int numcolbl = fNumberofColumnBlocks[r];
				if(numcolbl == 0) continue;
				for( c=0; c < numcolbl; c++) {
					int col = fColumnBlockNumber[colpos+c];
					int colblockpos = fColBlock.Position(col);
					int colblocksize = fColBlock.Size(col);
					TPZFMatrix<TVar> zloc(colblocksize,1,&z(colblockpos,ic),colblocksize);
					TPZFMatrix<TVar> aloc(rowblocksize,colblocksize,
									&fDoubleValues[fColumnBlockPosition[colpos+c]],rowblocksize*colblocksize);
					aloc.MultAdd(xloc,zloc,zloc,alpha,1.,opt);
					col = rowblockpos-1;
					rowblockpos = col+1;
				}
			}
		}
	}
}